

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O2

ebml_element *
EBML_FindNextElement
          (stream *Input,ebml_parser_context *pContext,int *UpperLevels,bool_t AllowDummyElt)

{
  ebml_parser_context *peVar1;
  int *piVar2;
  long lVar3;
  filepos_t fVar4;
  long lVar5;
  long lVar6;
  bool_t bVar7;
  ebml_element *peVar8;
  byte IdLength;
  uint uVar9;
  ulong uVar10;
  filepos_t fVar11;
  ebml_parser_context *peVar12;
  byte bVar13;
  long lVar14;
  undefined8 in_R9;
  ebml_parser_context *Context;
  ebml_parser_context *peVar15;
  size_t sVar16;
  bool bVar17;
  ebml_element *local_100;
  uint local_f4;
  int LevelChange;
  uint8_t PossibleIdNSize [16];
  size_t _SizeLength;
  int local_8c;
  ulong local_88;
  long local_80;
  size_t local_78;
  int *local_70;
  ebml_parser_context *local_68;
  filepos_t SizeUnknown;
  ebml_parser_context OrigContext;
  
  local_68 = pContext;
  if (Input == (stream *)0x0) {
    __assert_fail("(const void*)(Input)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                  ,0x1e2,
                  "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                 );
  }
  local_8c = *UpperLevels;
  lVar3 = (**(code **)((long)(Input->Base).VMT + 0x78))(Input,0,1);
  if (lVar3 != -1) {
    OrigContext.EndPosition = local_68->EndPosition;
    OrigContext.Profile = local_68->Profile;
    OrigContext._28_4_ = *(undefined4 *)&local_68->field_0x1c;
    OrigContext.Context = local_68->Context;
    OrigContext.UpContext = local_68->UpContext;
    peVar12 = &OrigContext;
    while (((peVar12->EndPosition != -1 && (peVar12->EndPosition <= lVar3)) &&
           (peVar15 = peVar12->UpContext, peVar15 != (ebml_parser_context *)0x0))) {
      *UpperLevels = *UpperLevels + 1;
      peVar12 = peVar15;
    }
    local_f4 = 0;
    bVar13 = 0;
    IdLength = 0;
    local_70 = UpperLevels;
    do {
      while( true ) {
        if ('\x0f' < (char)bVar13) {
          __assert_fail("ReadIndex < 16",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                        ,0x1fc,
                        "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                       );
        }
        for (uVar9 = 0; ((int)uVar9 < (int)(char)bVar13 && (uVar9 < 4)); uVar9 = uVar9 + 1) {
          if ((char)(PossibleIdNSize[0] << ((byte)uVar9 & 0x1f)) < '\0') {
            IdLength = (byte)uVar9 + 1;
            goto LAB_001108ac;
          }
        }
        if (peVar12->EndPosition == (ulong)local_f4 + lVar3) break;
        if ('\x03' < (char)bVar13) {
          bVar13 = bVar13 - 1;
          memmove(PossibleIdNSize,PossibleIdNSize + 1,(ulong)bVar13);
        }
        lVar14 = (**(code **)((long)(Input->Base).VMT + 0x60))
                           (Input,PossibleIdNSize + (char)bVar13,1);
        if (lVar14 != 0) {
          return (ebml_element *)0x0;
        }
        bVar13 = bVar13 + 1;
        local_f4 = local_f4 + 1;
      }
LAB_001108ac:
      uVar10 = (ulong)IdLength;
      sVar16 = (size_t)(char)(bVar13 - IdLength);
      while( true ) {
        _SizeLength = sVar16;
        fVar4 = EBML_ReadCodedSizeValue(PossibleIdNSize + uVar10,&_SizeLength,&SizeUnknown);
        bVar17 = _SizeLength != 0;
        lVar14 = (long)(char)bVar13;
        if ((bVar17) || (7 < (long)sVar16)) goto LAB_00110956;
        if (((0 < (long)sVar16) && (PossibleIdNSize[uVar10] == '\0')) ||
           (peVar12->EndPosition == (ulong)local_f4 + lVar3)) break;
        lVar14 = (**(code **)((long)(Input->Base).VMT + 0x60))(Input,PossibleIdNSize + lVar14,1);
        if (lVar14 != 0) {
          return (ebml_element *)0x0;
        }
        bVar13 = bVar13 + 1;
        local_f4 = local_f4 + 1;
        sVar16 = sVar16 + 1;
      }
      bVar17 = false;
LAB_00110956:
      lVar5 = (**(code **)((long)(Input->Base).VMT + 0x78))(Input,0,1);
      piVar2 = local_70;
      peVar15 = peVar12;
      if (bVar17) {
        Context = peVar12;
        if (fVar4 != SizeUnknown) {
          while ((Context->EndPosition != -1 && (Context->EndPosition < (fVar4 - lVar14) + lVar5)))
          {
            peVar15 = peVar12;
            if ((AllowDummyElt != 0) ||
               (peVar1 = Context->UpContext, peVar15 = Context, peVar1 == (ebml_parser_context *)0x0
               )) goto LAB_00110baa;
            *local_70 = *local_70 + 1;
            Context = peVar1;
          }
        }
        LevelChange = 0;
        in_R9 = 0;
        local_100 = EBML_ElementCreateUsingContext
                              (Input,PossibleIdNSize,IdLength,Context,&LevelChange,0,AllowDummyElt);
        peVar15 = Context;
        if (local_100 != (ebml_element *)0x0) {
          if ((AllowDummyElt != 0) || (bVar7 = EBML_ElementIsDummy(local_100), bVar7 == 0)) {
            if (8 < _SizeLength) {
              __assert_fail("_SizeLength <= 8",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                            ,0x24e,
                            "ebml_element *EBML_FindNextElement(struct stream *, const ebml_parser_context *, int *, bool_t)"
                           );
            }
            local_100->SizeLength = (int8_t)_SizeLength;
            local_100->DataSize = fVar4;
            local_78 = _SizeLength;
            if (fVar4 == SizeUnknown) {
              fVar11 = Context->EndPosition;
            }
            else {
              fVar11 = (uVar10 - lVar14) + lVar5 + fVar4 + _SizeLength;
            }
            local_80 = SizeUnknown;
            local_88 = (ulong)(fVar4 == SizeUnknown);
            local_100->EndPosition = fVar11;
            EBML_ElementSetInfiniteSize(local_100,local_88);
            if (((AllowDummyElt != 0) &&
                (lVar6 = (**(code **)((long)(local_100->Base).Base.VMT + 0x70))(), lVar6 == 0)) &&
               (bVar7 = EBML_ElementIsDummy(local_100), bVar7 == 0)) {
              NodeDelete((node *)local_100);
              local_100 = CreateElement(Input,PossibleIdNSize,IdLength,&EBML_ContextDummy,
                                        (ebml_master *)0xffffffffffffffff,(int)in_R9);
              local_100->SizeLength = (int8_t)local_78;
              local_100->DataSize = fVar4;
              if (fVar4 == local_80) {
                fVar11 = Context->EndPosition;
              }
              else {
                fVar11 = (uVar10 - lVar14) + lVar5 + fVar4 + local_78;
              }
              local_100->EndPosition = fVar11;
              EBML_ElementSetInfiniteSize(local_100,local_88);
            }
            lVar6 = (**(code **)((long)(local_100->Base).Base.VMT + 0x70))();
            if (lVar6 != 0) {
              if (fVar4 == local_80) {
                local_100->DataSize = -1;
              }
              if (0 < LevelChange) {
                *piVar2 = *piVar2 + LevelChange;
              }
              lVar3 = uVar10 + (lVar5 - lVar14);
              local_100->SizePosition = lVar3;
              local_100->ElementPosition = lVar5 - lVar14;
              (**(code **)((long)(Input->Base).VMT + 0x78))(Input,local_78 + lVar3,0);
              return local_100;
            }
          }
          NodeDelete((node *)local_100);
        }
      }
LAB_00110baa:
      lVar6 = peVar15->EndPosition;
      if ((lVar6 != -1) && (lVar6 <= lVar5)) {
        if (AllowDummyElt == 0) {
          return (ebml_element *)0x0;
        }
        if (lVar6 == lVar5) {
          return (ebml_element *)0x0;
        }
        peVar8 = CreateElement(Input,PossibleIdNSize,IdLength,&EBML_ContextDummy,
                               (ebml_master *)0xffffffffffffffff,(int)in_R9);
        if (peVar8 == (ebml_element *)0x0) {
          return (ebml_element *)0x0;
        }
        lVar3 = uVar10 + (lVar5 - lVar14);
        peVar8->SizePosition = lVar3;
        peVar8->ElementPosition = lVar5 - lVar14;
        peVar8->DataSize = 0;
        fVar4 = peVar15->EndPosition;
        peVar8->SizeLength = (char)fVar4 - (char)lVar3;
        peVar8->EndPosition = fVar4;
        (**(code **)((long)(Input->Base).VMT + 0x78))(Input,fVar4,0);
        return peVar8;
      }
      bVar13 = bVar13 - 1;
      memmove(PossibleIdNSize,PossibleIdNSize + 1,(long)(char)bVar13);
      *piVar2 = local_8c;
      OrigContext.EndPosition = local_68->EndPosition;
      OrigContext.Profile = local_68->Profile;
      OrigContext._28_4_ = *(undefined4 *)&local_68->field_0x1c;
      OrigContext.Context = local_68->Context;
      OrigContext.UpContext = local_68->UpContext;
      peVar12 = &OrigContext;
    } while ((OrigContext.EndPosition == -1) ||
            ((long)((uVar10 - lVar14) + lVar5) < OrigContext.EndPosition));
  }
  return (ebml_element *)0x0;
}

Assistant:

ebml_element *EBML_FindNextElement(struct stream *Input, const ebml_parser_context *pContext, int *UpperLevels, bool_t AllowDummyElt)
{
    uint8_t PossibleID_Length = 0;
    uint8_t PossibleIdNSize[16];
    int PossibleSizeLength;
    filepos_t SizeUnknown;
    int8_t SizeIdx,ReadIndex = 0; // trick for the algo, start index at 0
    uint32_t ReadSize = 0;
    filepos_t SizeFound;
    bool_t bFound;
    int UpperLevel_original = *UpperLevels;
    filepos_t CurrentPos;
    filepos_t StartPos = Stream_Seek(Input,0,SEEK_CUR);
    ebml_parser_context OrigContext;
    const ebml_parser_context *Context = &OrigContext;

    if (StartPos == INVALID_FILEPOS_T)
        return NULL;

    assert(Context != NULL);
    OrigContext = *pContext;

    // adjust the Context to allow the StartPos to make sense
    while (Context && Context->EndPosition != INVALID_FILEPOS_T && (StartPos >= Context->EndPosition))
    {
        if (Context->UpContext==NULL)
            break;
        Context = Context->UpContext;
        (*UpperLevels)++;
    }

    do {
        size_t _SizeLength;

        // read a potential ID
        do {
            uint8_t IdBitMask = 1 << 7;

            assert(ReadIndex < 16);
            // build the ID with the current Read Buffer
            bFound = 0;
            for (SizeIdx = 0; SizeIdx < ReadIndex && SizeIdx < 4; SizeIdx++) {
                if (PossibleIdNSize[0] & (IdBitMask >> SizeIdx)) {
                    // ID found
                    PossibleID_Length = SizeIdx + 1;
                    IdBitMask >>= SizeIdx;
                    bFound = 1;
                    break;
                }
            }
            if (bFound)
                break;
            if (Context->EndPosition == StartPos+ReadSize)
                break; // we should not read further than our limit

            if (ReadIndex >= 4) {
                // ID not found
                // shift left the read octets
                memmove(&PossibleIdNSize[0],&PossibleIdNSize[1], --ReadIndex);
            }

            if (Stream_ReadOneOrMore(Input,&PossibleIdNSize[ReadIndex++], 1, NULL)!=ERR_NONE)
                return NULL; // no more data ?
            ReadSize++;

        } while (!bFound);

        SizeIdx = ReadIndex;
        ReadIndex = ReadIndex - PossibleID_Length;

        // read the data size
        PossibleSizeLength = ReadIndex;
        bFound = 0;
        while (1)
        {
            _SizeLength = PossibleSizeLength;
            SizeFound = EBML_ReadCodedSizeValue(&PossibleIdNSize[PossibleID_Length], &_SizeLength, &SizeUnknown);
            if (_SizeLength != 0) {
                bFound = 1;
                break;
            }
            if (PossibleSizeLength >= 8)
                break;
            if (PossibleSizeLength > 0 && PossibleIdNSize[PossibleID_Length] == 0)
                break; // invalid all zero size
            if (Context->EndPosition == StartPos+ReadSize)
                break; // we should not read further than our limit
            if (Stream_ReadOneOrMore(Input,&PossibleIdNSize[SizeIdx++], 1, NULL)!=ERR_NONE)
                return NULL;
            ReadSize++;
            PossibleSizeLength++;
        }

        CurrentPos = Stream_Seek(Input,0,SEEK_CUR);
        if (bFound)
        {
            // make sure the element we found is contained in the Context
            if (SizeFound != SizeUnknown)
            {
                while (Context && Context->EndPosition != INVALID_FILEPOS_T && (CurrentPos + SizeFound - SizeIdx > Context->EndPosition))
                {
                    if (AllowDummyElt || Context->UpContext==NULL)
                    {
                        bFound = 0;
                        break;
                    }
                    Context = Context->UpContext;
                    (*UpperLevels)++;
                }
            }
        }

        if (bFound)
        {
            // find the element in the context and use the correct creator
            int LevelChange = 0;
            ebml_element *Result = EBML_ElementCreateUsingContext(Input, PossibleIdNSize, PossibleID_Length, Context, &LevelChange, 0, AllowDummyElt);
            if (Result != NULL)
            {
                if (AllowDummyElt || !EBML_ElementIsDummy(Result)) {
                    assert(_SizeLength <= 8);
                    Result->SizeLength = (int8_t)_SizeLength;
                    Result->DataSize = SizeFound;
                    Result->EndPosition = (SizeFound == SizeUnknown) ? Context->EndPosition : (filepos_t)(CurrentPos - SizeIdx + PossibleID_Length + _SizeLength + SizeFound);
                    EBML_ElementSetInfiniteSize(Result, SizeFound == SizeUnknown);

                    if (AllowDummyElt && !EBML_ElementValidateSize(Result) && !EBML_ElementIsDummy(Result))
                    {
                        // the element has a good ID but wrong size, so replace with a dummy
                        NodeDelete((node*)Result);
                        Result = CreateElement(Input, PossibleIdNSize, PossibleID_Length, &EBML_ContextDummy, NULL, EBML_ANY_PROFILE);
                        Result->SizeLength = (int8_t)_SizeLength;
                        Result->DataSize = SizeFound;
                        Result->EndPosition = (SizeFound == SizeUnknown) ? Context->EndPosition : (filepos_t)(CurrentPos - SizeIdx + PossibleID_Length + _SizeLength + SizeFound);
                        EBML_ElementSetInfiniteSize(Result, SizeFound == SizeUnknown);
                    }

                    // LevelChange values
                    // -1 : global element
                    //  0 : child
                    //  1 : same level
                    //  + : further parent
                    if (EBML_ElementValidateSize(Result))
                    {
                        if (SizeFound == SizeUnknown)
                        {
                            Result->DataSize = INVALID_FILEPOS_T;
                        }

                        if (LevelChange > 0)
                            *UpperLevels += LevelChange;
                        Result->SizePosition = CurrentPos - SizeIdx + PossibleID_Length;
                        Result->ElementPosition = Result->SizePosition - PossibleID_Length;
                        // place the file at the beggining of the data
                        Stream_Seek(Input,Result->SizePosition + _SizeLength,SEEK_SET);
                        return Result;
                    }
                }
                NodeDelete((node*)Result);
            }
        }

        if (Context->EndPosition!=INVALID_FILEPOS_T && Context->EndPosition <= CurrentPos)
        {
            if (AllowDummyElt && Context->EndPosition != CurrentPos)
            {
                /* add a dummy placeholder for the remaining of the parent */
                int LevelChange = 0;
                ebml_element *Result = CreateElement(Input, PossibleIdNSize, PossibleID_Length, &EBML_ContextDummy, NULL, EBML_ANY_PROFILE);
                if (Result != NULL)
                {
                    if (LevelChange > 0)
                        *UpperLevels += LevelChange;
                    Result->SizePosition = CurrentPos - SizeIdx + PossibleID_Length;
                    Result->ElementPosition = Result->SizePosition - PossibleID_Length;
                    Result->DataSize = 0;
                    Result->SizeLength = (int8_t)(Context->EndPosition - Result->SizePosition);
                    Result->EndPosition = Context->EndPosition;
                    // place the file at the end of the element
                    Stream_Seek(Input,Context->EndPosition,SEEK_SET);
                    return Result;
                }
            }
            break; // we should not read further than our limit
        }

        // recover all the data in the buffer minus one byte
        ReadIndex = SizeIdx - 1;
        memmove(&PossibleIdNSize[0], &PossibleIdNSize[1], ReadIndex);
        *UpperLevels = UpperLevel_original;
        OrigContext = *pContext;
        Context = &OrigContext;
    } while (Context->EndPosition==INVALID_FILEPOS_T || (Context->EndPosition > CurrentPos - SizeIdx + PossibleID_Length));

    return NULL;
}